

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_view_2d(ggml_context *ctx,ggml_tensor *a,int64_t ne0,int64_t ne1,size_t nb1,size_t offset)

{
  ggml_tensor *pgVar1;
  long in_RCX;
  int64_t *in_RDX;
  size_t in_R8;
  ggml_context *in_R9;
  ggml_tensor *result;
  int64_t ne [2];
  size_t in_stack_ffffffffffffffb0;
  ggml_tensor *in_stack_ffffffffffffffc8;
  
  pgVar1 = ggml_view_impl(in_R9,in_stack_ffffffffffffffc8,(int)((ulong)in_RCX >> 0x20),in_RDX,
                          in_stack_ffffffffffffffb0);
  pgVar1->nb[1] = in_R8;
  pgVar1->nb[2] = pgVar1->nb[1] * in_RCX;
  pgVar1->nb[3] = pgVar1->nb[2];
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_view_2d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int64_t               ne0,
        int64_t               ne1,
        size_t                nb1,
        size_t                offset) {
    const int64_t ne[2] = { ne0, ne1 };

    struct ggml_tensor * result = ggml_view_impl(ctx, a, 2, ne, offset);

    result->nb[1] = nb1;
    result->nb[2] = result->nb[1]*ne1;
    result->nb[3] = result->nb[2];

    return result;
}